

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O2

unique_ptr<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
 HawkTracer::parser::make_unique<HawkTracer::client::CallgrindConverter>(void)

{
  CallgrindConverter *this;
  __uniq_ptr_data<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>,_true,_true>
  in_RDI;
  
  this = (CallgrindConverter *)operator_new(0xb0);
  memset(this,0,0xb0);
  client::CallgrindConverter::CallgrindConverter(this);
  *(CallgrindConverter **)
   in_RDI.
   super___uniq_ptr_impl<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
   ._M_t.
   super__Tuple_impl<0UL,_HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
   .super__Head_base<0UL,_HawkTracer::client::CallgrindConverter_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>,_true,_true>
          )(tuple<HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
            )in_RDI.
             super___uniq_ptr_impl<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
             ._M_t.
             super__Tuple_impl<0UL,_HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
             .super__Head_base<0UL,_HawkTracer::client::CallgrindConverter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}